

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::GenerateFastReplace
          (Lowerer *this,Opnd *strOpnd,Opnd *src1,Opnd *src2,Instr *callInstr,Instr *insertInstr,
          LabelInstr *labelHelper,LabelInstr *doneLabel)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  RegOpnd *pRVar5;
  Opnd *pOVar6;
  RegOpnd *this_01;
  Lowerer *pLVar7;
  IndirOpnd *compareSrc1;
  Instr *this_02;
  BailOutInfo *bailoutInfo;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  RegOpnd *local_40;
  Opnd *local_38;
  
  local_38 = callInstr->m_dst;
  local_48 = (strOpnd->m_valueType).field_0;
  bVar2 = ValueType::IsLikelyString((ValueType *)&local_48.field_0);
  local_40 = (RegOpnd *)src2;
  if (bVar2) {
    local_46 = (src2->m_valueType).field_0;
    bVar2 = ValueType::IsLikelyString((ValueType *)&local_46.field_0);
    if (bVar2) goto LAB_0057615d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x4fcf,
                     "(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString())"
                     ,
                     "strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString()"
                    );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar4 = 0;
LAB_0057615d:
  local_44 = (strOpnd->m_valueType).field_0;
  paVar8 = &local_44;
  bVar2 = ValueType::IsString((ValueType *)&paVar8->field_0);
  if (!bVar2) {
    strOpnd = &GetRegOpnd((Lowerer *)&paVar8->field_0,strOpnd,insertInstr,this->m_func,TyVar)->
               super_Opnd;
    pRVar5 = IR::Opnd::AsRegOpnd(strOpnd);
    GenerateStringTest(this,pRVar5,insertInstr,labelHelper,(LabelInstr *)0x0,true);
  }
  bVar2 = IR::Opnd::IsNotTaggedValue(src1);
  if (!bVar2) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,src1,insertInstr,labelHelper,false);
  }
  pLVar7 = this;
  pOVar6 = LoadVTableValueOpnd(this,insertInstr,VtableJavascriptRegExp);
  this_01 = GetRegOpnd(pLVar7,src1,insertInstr,this->m_func,TyVar);
  pLVar7 = (Lowerer *)IR::Opnd::AsRegOpnd(&this_01->super_Opnd);
  compareSrc1 = IR::IndirOpnd::New((RegOpnd *)pLVar7,0,TyUint64,insertInstr->m_func,false);
  InsertCompareBranch(pLVar7,&compareSrc1->super_Opnd,pOVar6,BrNeq_A,labelHelper,insertInstr,false);
  pRVar5 = local_40;
  local_42 = (local_40->super_Opnd).m_valueType.field_0;
  paVar8 = &local_42;
  bVar2 = ValueType::IsString((ValueType *)&paVar8->field_0);
  if (!bVar2) {
    local_40 = GetRegOpnd((Lowerer *)&paVar8->field_0,&pRVar5->super_Opnd,insertInstr,this->m_func,
                          TyVar);
    pRVar5 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
    GenerateStringTest(this,pRVar5,insertInstr,labelHelper,(LabelInstr *)0x0,true);
  }
  pOVar6 = local_38;
  this_02 = IR::Instr::New(CALL,insertInstr->m_func);
  if (pOVar6 != (Opnd *)0x0) {
    IR::Instr::SetDst(this_02,pOVar6);
  }
  IR::Instr::InsertBefore(insertInstr,this_02);
  if ((insertInstr->field_0x38 & 0x10) != 0) {
    BVar3 = IR::Instr::GetBailOutKind(insertInstr);
    if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) == BailOutOnImplicitCalls) {
      bailoutInfo = IR::Instr::GetBailOutInfo(insertInstr);
      BVar3 = IR::Instr::GetBailOutKind(insertInstr);
      this_02 = AddBailoutToHelperCallInstr(this,this_02,bailoutInfo,BVar3,insertInstr);
    }
  }
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,this_02,&local_40->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,this_02,strOpnd);
  LowererMD::LoadHelperArgument(this_00,this_02,&this_01->super_Opnd);
  LoadScriptContext(this,this_02);
  LowererMD::ChangeToHelperCall
            (this_00,this_02,(local_38 == (Opnd *)0x0) + HelperRegExp_ReplaceStringResultUsed,
             (LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return true;
}

Assistant:

bool
Lowerer::GenerateFastReplace(IR::Opnd* strOpnd, IR::Opnd* src1, IR::Opnd* src2, IR::Instr *callInstr, IR::Instr *insertInstr, IR::LabelInstr *labelHelper, IR::LabelInstr *doneLabel)
{
    // a.replace(b,c)
    // We want to emit the fast path if 'a' and 'c' are strings and 'b' is a regex
    //
    // strOpnd --> a
    // src1    --> b
    // src2    --> c

    IR::Opnd * callDst = callInstr->GetDst();

    Assert(strOpnd->GetValueType().IsLikelyString() && src2->GetValueType().IsLikelyString());

    if(!strOpnd->GetValueType().IsString())
    {
        strOpnd = GetRegOpnd(strOpnd, insertInstr, m_func, TyVar);

        this->GenerateStringTest(strOpnd->AsRegOpnd(), insertInstr, labelHelper);
    }

    if(!src1->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(src1, insertInstr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(insertInstr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    src1 = GetRegOpnd(src1, insertInstr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(src1->AsRegOpnd(), 0, TyMachPtr, insertInstr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        insertInstr);

    if(!src2->GetValueType().IsString())
    {
        src2 = GetRegOpnd(src2, insertInstr, m_func, TyVar);
        this->GenerateStringTest(src2->AsRegOpnd(), insertInstr, labelHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, insertInstr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    insertInstr->InsertBefore(helperCallInstr);

    if (insertInstr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(insertInstr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, insertInstr->GetBailOutInfo(), insertInstr->GetBailOutKind(), insertInstr);
    }

    //scriptContext, pRegEx, pThis, pReplace (to be pushed in reverse order)

    // pReplace, pThis, pRegEx
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src2);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, strOpnd);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, src1);

    // script context
    LoadScriptContext(helperCallInstr);

    if(callDst)
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultUsed);
    }
    else
    {
        m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::JnHelperMethod::HelperRegExp_ReplaceStringResultNotUsed);
    }

    return true;
}